

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int uv_fs_sendfile(uv_loop_t *loop,uv_fs_t *req,uv_file out_fd,uv_file in_fd,int64_t off,size_t len,
                  uv_fs_cb cb)

{
  int iVar1;
  
  if (req != (uv_fs_t *)0x0) {
    req->type = UV_FS;
    req->fs_type = UV_FS_SENDFILE;
    req->result = 0;
    req->ptr = (void *)0x0;
    req->loop = loop;
    req->path = (char *)0x0;
    req->new_path = (char *)0x0;
    req->bufs = (uv_buf_t *)0x0;
    req->cb = cb;
    req->flags = in_fd;
    req->file = out_fd;
    req->off = off;
    req->bufsml[0].len = len;
    if (cb == (uv_fs_cb)0x0) {
      uv__fs_work(&req->work_req);
      iVar1 = (int)req->result;
    }
    else {
      (loop->active_reqs).count = (loop->active_reqs).count + 1;
      uv__work_submit(loop,&req->work_req,UV__WORK_FAST_IO,uv__fs_work,uv__fs_done);
      iVar1 = 0;
    }
    return iVar1;
  }
  return -0x16;
}

Assistant:

int uv_fs_sendfile(uv_loop_t* loop,
                   uv_fs_t* req,
                   uv_file out_fd,
                   uv_file in_fd,
                   int64_t off,
                   size_t len,
                   uv_fs_cb cb) {
  INIT(SENDFILE);
  req->flags = in_fd; /* hack */
  req->file = out_fd;
  req->off = off;
  req->bufsml[0].len = len;
  POST;
}